

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTable.cpp
# Opt level: O2

void __thiscall KeyWordTable::KeyWordTable(KeyWordTable *this)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  pointer pbVar3;
  mapped_type *pmVar4;
  long lVar5;
  pointer pbVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_516;
  allocator local_515;
  allocator local_514;
  allocator local_513;
  allocator local_512;
  allocator local_511;
  allocator local_510;
  allocator local_50f;
  allocator local_50e;
  allocator local_50d;
  allocator local_50c;
  allocator local_50b;
  allocator local_50a;
  allocator local_509;
  allocator local_508;
  allocator local_507;
  allocator local_506;
  allocator local_505;
  allocator local_504;
  allocator local_503;
  allocator local_502;
  allocator local_501;
  allocator local_500;
  allocator local_4ff;
  allocator local_4fe;
  allocator local_4fd;
  allocator local_4fc;
  allocator local_4fb;
  allocator local_4fa;
  allocator local_4f9;
  allocator local_4f8;
  allocator local_4f7;
  allocator local_4f6;
  allocator local_4f5;
  allocator local_4f4;
  allocator local_4f3;
  allocator local_4f2;
  allocator local_4f1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_4f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keyWord;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> c;
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  (this->
  super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  tokenTable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  tokenTable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  tokenTable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->
            super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).index._M_t._M_impl.super__Rb_tree_header;
  (this->
  super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->
  super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->
  super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  index._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->
  super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  index._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->
  super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&c,"auto",&local_4f1);
  std::__cxx11::string::string(local_4b0,"short",&local_4f2);
  std::__cxx11::string::string(local_490,"int",&local_4f3);
  std::__cxx11::string::string(local_470,"long",&local_4f4);
  std::__cxx11::string::string(local_450,"real",&local_4f5);
  std::__cxx11::string::string(local_430,"double",&local_4f6);
  std::__cxx11::string::string(local_410,"char",&local_4f7);
  std::__cxx11::string::string(local_3f0,"struct",&local_4f8);
  std::__cxx11::string::string(local_3d0,"union",&local_4f9);
  std::__cxx11::string::string(local_3b0,"enum",&local_4fa);
  std::__cxx11::string::string(local_390,"typedef",&local_4fb);
  std::__cxx11::string::string(local_370,"const",&local_4fc);
  std::__cxx11::string::string(local_350,"unsigned",&local_4fd);
  std::__cxx11::string::string(local_330,"signed",&local_4fe);
  std::__cxx11::string::string(local_310,"extern",&local_4ff);
  std::__cxx11::string::string(local_2f0,"register",&local_500);
  std::__cxx11::string::string(local_2d0,"static",&local_501);
  std::__cxx11::string::string(local_2b0,"volatile",&local_502);
  std::__cxx11::string::string(local_290,"void",&local_503);
  std::__cxx11::string::string(local_270,"if",&local_504);
  std::__cxx11::string::string(local_250,"else",&local_505);
  std::__cxx11::string::string(local_230,"switch",&local_506);
  std::__cxx11::string::string(local_210,"case",&local_507);
  std::__cxx11::string::string(local_1f0,"for",&local_508);
  std::__cxx11::string::string(local_1d0,"do",&local_509);
  std::__cxx11::string::string(local_1b0,"while",&local_50a);
  std::__cxx11::string::string(local_190,"goto",&local_50b);
  std::__cxx11::string::string(local_170,"continue",&local_50c);
  std::__cxx11::string::string(local_150,"break",&local_50d);
  std::__cxx11::string::string(local_130,"default",&local_50e);
  std::__cxx11::string::string(local_110,"sizeof",&local_50f);
  std::__cxx11::string::string(local_f0,"return",&local_510);
  std::__cxx11::string::string(local_d0,"bool",&local_511);
  std::__cxx11::string::string(local_b0,"cout",&local_512);
  std::__cxx11::string::string(local_90,"use",&local_513);
  std::__cxx11::string::string(local_70,"func",&local_514);
  std::__cxx11::string::string(local_50,"string",&local_515);
  __l._M_len = 0x25;
  __l._M_array = &c;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&keyWord,__l,&local_516);
  lVar5 = 0x480;
  do {
    std::__cxx11::string::~string(local_4b0 + lVar5 + -0x20);
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  local_4f0 = &(this->
               super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).index;
  for (pbVar6 = keyWord.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 != keyWord.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
    std::__cxx11::string::string((string *)&c,(string *)pbVar6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,&c);
    pbVar2 = (this->
             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).tokenTable.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->
             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).tokenTable.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](local_4f0,&c);
    *pmVar4 = (mapped_type)((ulong)((long)pbVar3 - (long)pbVar2) >> 5);
    std::__cxx11::string::~string((string *)&c);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&keyWord);
  return;
}

Assistant:

KeyWordTable::KeyWordTable() {
    vector<string> keyWord = { "auto" , "short" , "int" , "long" , "real" ,
                               "double" , "char" , "struct" , "union" , "enum" , "typedef" ,
                               "const" , "unsigned" , "signed" , "extern" , "register" , "static" ,
                               "volatile" , "void" , "if" , "else" , "switch" , "case" , "for" ,
                               "do" , "while" , "goto" , "continue" , "break" , "default" ,
                               "sizeof" , "return" , "bool" , "cout", "use", "func", "string"};
    for(auto c : keyWord) {
        tokenTable.push_back(c);
        index[c] = static_cast<int>(tokenTable.size());
    }
}